

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

int32_t __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsI32(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  allocator local_59;
  shared_ptr<const_Assimp::FIIntValue> intValue;
  string local_48;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_48,pFVar1,pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIIntValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)&intValue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  if (intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar3 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
    iVar3 = strtol10((char *)CONCAT44(extraout_var,iVar3),(char **)0x0);
  }
  else {
    piVar2 = ((intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)piVar2 != 4) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_48,"Invalid int value",&local_59);
      DeadlyImportError::DeadlyImportError(this_00,&local_48);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = *piVar2;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar3;
}

Assistant:

int32_t X3DImporter::XML_ReadNode_GetAttrVal_AsI32(const int pAttrIdx)
{
    auto intValue = std::dynamic_pointer_cast<const FIIntValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (intValue) {
        if (intValue->value.size() == 1) {
            return intValue->value.front();
        }
        throw DeadlyImportError("Invalid int value");
    }
    else {
        return strtol10(mReader->getAttributeValue(pAttrIdx));
    }
}